

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O2

void SplitByteVectorDistance
               (MemoryManager *m,uint16_t *data,size_t length,size_t literals_per_histogram,
               size_t max_histograms,size_t sampling_stride_length,double block_switch_cost,
               BrotliEncoderParams *params,BlockSplit *split)

{
  int *piVar1;
  byte *pbVar2;
  char *pcVar3;
  long *plVar4;
  uint uVar5;
  ushort uVar6;
  size_t byte_ix;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ushort *puVar10;
  void *pvVar11;
  void *pvVar12;
  void *p;
  ulong uVar13;
  HistogramDistance *out;
  ulong uVar14;
  HistogramDistance *pHVar15;
  uint32_t *puVar16;
  long lVar17;
  size_t sVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  uint *puVar22;
  void *pvVar23;
  ulong uVar24;
  byte bVar25;
  long lVar26;
  ulong uVar27;
  uint *puVar28;
  ulong uVar29;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  HistogramDistance *local_d60;
  double local_d40;
  uint32_t *local_d38;
  ulong local_d30;
  void *local_d28;
  uint32_t *local_d18;
  long local_d00;
  HistogramPair *local_cf8;
  uint32_t *local_ce8;
  ulong local_cd8;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  HistogramDistance local_8c0;
  
  uVar13 = length / 0x220 + 1;
  if (literals_per_histogram <= length / 0x220) {
    uVar13 = literals_per_histogram;
  }
  if (length == 0) {
    *(undefined8 *)sampling_stride_length = 1;
  }
  else {
    if (0x7f < length) {
      pvVar8 = BrotliAllocate(m,uVar13 * 0x890);
      uVar21 = uVar13;
      pvVar7 = pvVar8;
      while (bVar33 = uVar21 != 0, uVar21 = uVar21 - 1, bVar33) {
        memset(pvVar7,0,0x888);
        *(undefined8 *)((long)pvVar7 + 0x888) = 0x7ff0000000000000;
        pvVar7 = (void *)((long)pvVar7 + 0x890);
      }
      uVar21 = 7;
      for (uVar27 = 0; uVar27 != uVar13; uVar27 = uVar27 + 1) {
        uVar9 = (uVar27 * length) / uVar13;
        if (uVar27 != 0) {
          uVar21 = (ulong)(uint)((int)uVar21 * 0x41a7);
          uVar9 = uVar9 + uVar21 % (length / uVar13);
        }
        if (length <= uVar9 + 0x28) {
          uVar9 = length - 0x29;
        }
        plVar4 = (long *)((long)pvVar8 + uVar27 * 0x890 + 0x880);
        *plVar4 = *plVar4 + 0x28;
        for (lVar26 = 0; lVar26 != 0x28; lVar26 = lVar26 + 1) {
          piVar1 = (int *)((long)pvVar8 + (ulong)data[uVar9 + lVar26] * 4 + uVar27 * 0x890);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar9 = (length * 2) / 0x28 + uVar13 + 99;
      uVar21 = 7;
      for (uVar27 = 0; uVar27 < uVar9 - uVar9 % uVar13; uVar27 = uVar27 + 1) {
        memset(&local_8c0,0,0x888);
        uVar21 = (ulong)(uint)((int)uVar21 * 0x41a7);
        puVar10 = data + uVar21 % (length - 0x27);
        for (lVar26 = -0x28; lVar26 != 0; lVar26 = lVar26 + 1) {
          uVar6 = *puVar10;
          puVar10 = puVar10 + 1;
          local_8c0.data_[uVar6] = local_8c0.data_[uVar6] + 1;
        }
        lVar26 = (uVar27 % uVar13) * 0x890;
        plVar4 = (long *)((long)pvVar8 + lVar26 + 0x880);
        *plVar4 = *plVar4 + 0x28;
        for (lVar17 = 0; lVar17 != 0x220; lVar17 = lVar17 + 1) {
          piVar1 = (int *)((long)pvVar8 + lVar17 * 4 + lVar26);
          *piVar1 = *piVar1 + local_8c0.data_[lVar17];
        }
      }
      pvVar7 = BrotliAllocate(m,length);
      pvVar11 = BrotliAllocate(m,uVar13 * 0x1100);
      pvVar12 = BrotliAllocate(m,uVar13 * 8);
      sVar31 = (uVar13 + 7 >> 3) * length;
      if (sVar31 == 0) {
        local_d28 = (void *)0x0;
      }
      else {
        local_d28 = BrotliAllocate(m,sVar31);
      }
      p = BrotliAllocate(m,uVar13 * 2);
      lVar26 = 3;
      if (10 < *(int *)(max_histograms + 4)) {
        lVar26 = 10;
      }
      uVar21 = 0;
      for (lVar17 = 0; lVar17 != lVar26; lVar17 = lVar17 + 1) {
        if (uVar13 < 2) {
          for (sVar31 = 0; length != sVar31; sVar31 = sVar31 + 1) {
            *(undefined1 *)((long)pvVar7 + sVar31) = 0;
          }
          uVar21 = 1;
        }
        else {
          uVar27 = uVar13 + 7 >> 3;
          memset(pvVar11,0,uVar13 * 0x1100);
          puVar22 = (uint *)((long)pvVar8 + 0x880);
          for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
            uVar9 = (ulong)*puVar22;
            if (uVar9 < 0x100) {
              dVar34 = kLog2Table[uVar9];
            }
            else {
              dVar34 = log2((double)uVar9);
            }
            *(double *)((long)pvVar11 + uVar21 * 8) = dVar34;
            puVar22 = puVar22 + 0x224;
          }
          pvVar23 = (void *)(uVar13 * 0x10f8 + (long)pvVar11);
          lVar30 = 0x220;
          puVar22 = (uint *)((long)pvVar8 + 0x87c);
          while (bVar33 = lVar30 != 0, lVar30 = lVar30 + -1, bVar33) {
            puVar28 = puVar22;
            for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
              dVar34 = *(double *)((long)pvVar11 + uVar21 * 8);
              uVar9 = (ulong)*puVar28;
              dVar35 = -2.0;
              if (uVar9 != 0) {
                if (*puVar28 < 0x100) {
                  dVar35 = kLog2Table[uVar9];
                }
                else {
                  dVar35 = log2((double)uVar9);
                }
              }
              *(double *)((long)pvVar23 + uVar21 * 8) = dVar34 - dVar35;
              puVar28 = puVar28 + 0x224;
            }
            pvVar23 = (void *)((long)pvVar23 + uVar13 * -8);
            puVar22 = puVar22 + -1;
          }
          memset(pvVar12,0,uVar13 * 8);
          memset(local_d28,0,uVar27 * length);
          for (uVar21 = 0; uVar21 != length; uVar21 = uVar21 + 1) {
            uVar6 = data[uVar21];
            dVar34 = 1e+99;
            for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
              dVar35 = *(double *)((long)pvVar11 + uVar9 * 8 + uVar6 * uVar13 * 8) +
                       *(double *)((long)pvVar12 + uVar9 * 8);
              *(double *)((long)pvVar12 + uVar9 * 8) = dVar35;
              if (dVar35 < dVar34) {
                *(char *)((long)pvVar7 + uVar21) = (char)uVar9;
                dVar34 = dVar35;
              }
            }
            dVar35 = 14.6;
            if (uVar21 < 2000) {
              dVar35 = (((double)(long)uVar21 * 0.07) / 2000.0 + 0.77) * 14.6;
            }
            for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
              dVar36 = *(double *)((long)pvVar12 + uVar9 * 8) - dVar34;
              *(double *)((long)pvVar12 + uVar9 * 8) = dVar36;
              if (dVar35 <= dVar36) {
                *(double *)((long)pvVar12 + uVar9 * 8) = dVar35;
                pbVar2 = (byte *)((long)local_d28 + (uVar9 >> 3) + uVar21 * uVar27);
                *pbVar2 = *pbVar2 | '\x01' << ((byte)uVar9 & 7);
              }
            }
          }
          bVar19 = *(byte *)((long)pvVar7 + (length - 1));
          pvVar23 = (void *)((length - 2) * uVar27 + (long)local_d28);
          uVar21 = 1;
          for (sVar31 = length; sVar31 != 1; sVar31 = sVar31 - 1) {
            if ((*(byte *)((long)pvVar23 + (ulong)(bVar19 >> 3)) >> (bVar19 & 7) & 1) != 0) {
              bVar25 = *(byte *)((long)pvVar7 + (sVar31 - 2));
              uVar21 = uVar21 + (bVar19 != bVar25);
              bVar19 = bVar25;
            }
            *(byte *)((long)pvVar7 + (sVar31 - 2)) = bVar19;
            pvVar23 = (void *)((long)pvVar23 - uVar27);
          }
        }
        for (uVar27 = 0; uVar13 != uVar27; uVar27 = uVar27 + 1) {
          *(undefined2 *)((long)p + uVar27 * 2) = 0x100;
        }
        uVar6 = 0;
        for (sVar31 = 0; length != sVar31; sVar31 = sVar31 + 1) {
          if (*(short *)((long)p + (ulong)*(byte *)((long)pvVar7 + sVar31) * 2) == 0x100) {
            *(ushort *)((long)p + (ulong)*(byte *)((long)pvVar7 + sVar31) * 2) = uVar6;
            uVar6 = uVar6 + 1;
          }
        }
        for (sVar31 = 0; length != sVar31; sVar31 = sVar31 + 1) {
          *(undefined1 *)((long)pvVar7 + sVar31) =
               *(undefined1 *)((long)p + (ulong)*(byte *)((long)pvVar7 + sVar31) * 2);
        }
        uVar13 = (ulong)uVar6;
        for (lVar30 = 0; uVar13 * 0x890 - lVar30 != 0; lVar30 = lVar30 + 0x890) {
          memset((void *)((long)pvVar8 + lVar30),0,0x888);
          *(undefined8 *)((long)pvVar8 + lVar30 + 0x888) = 0x7ff0000000000000;
        }
        for (sVar31 = 0; length != sVar31; sVar31 = sVar31 + 1) {
          lVar30 = (ulong)*(byte *)((long)pvVar7 + sVar31) * 0x890;
          piVar1 = (int *)((long)pvVar8 + (ulong)data[sVar31] * 4 + lVar30);
          *piVar1 = *piVar1 + 1;
          plVar4 = (long *)((long)pvVar8 + lVar30 + 0x880);
          *plVar4 = *plVar4 + 1;
        }
      }
      BrotliFree(m,pvVar11);
      BrotliFree(m,pvVar12);
      BrotliFree(m,local_d28);
      BrotliFree(m,p);
      BrotliFree(m,pvVar8);
      if (uVar21 == 0) {
        local_d38 = (uint32_t *)0x0;
        pvVar8 = (void *)0x0;
      }
      else {
        local_d38 = (uint32_t *)BrotliAllocate(m,uVar21 * 4);
        pvVar8 = BrotliAllocate(m,uVar21 * 4);
      }
      uVar13 = uVar21 * 0x10 + 0x3f0;
      local_d30 = uVar13 >> 6;
      if (uVar13 < 0x40) {
        out = (HistogramDistance *)0x0;
        local_d18 = (uint32_t *)0x0;
      }
      else {
        out = (HistogramDistance *)BrotliAllocate(m,local_d30 * 0x890);
        local_d18 = (uint32_t *)BrotliAllocate(m,local_d30 * 4);
      }
      if (uVar21 == 0) {
        local_d60 = (HistogramDistance *)0x0;
      }
      else {
        uVar13 = 0x40;
        if (uVar21 < 0x40) {
          uVar13 = uVar21;
        }
        local_d60 = (HistogramDistance *)BrotliAllocate(m,uVar13 * 0x890);
      }
      local_cf8 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar8,0,uVar21 * 4);
      lVar26 = 0;
      sVar31 = 0;
      while (sVar18 = sVar31 + 1, sVar18 - length != 1) {
        piVar1 = (int *)((long)pvVar8 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar18 == length) ||
           (pcVar3 = (char *)((long)pvVar7 + sVar31), sVar31 = sVar18,
           *pcVar3 != *(char *)((long)pvVar7 + sVar18))) {
          lVar26 = lVar26 + 1;
          sVar31 = sVar18;
        }
      }
      local_d40 = 0.0;
      local_ce8 = local_d38;
      uVar9 = 0;
      uVar27 = 0;
      local_d00 = 0;
      local_d28 = (void *)0x0;
      uVar13 = uVar21;
      local_cd8 = local_d30;
      while( true ) {
        uVar14 = 0x40;
        if (uVar13 < 0x40) {
          uVar14 = uVar13;
        }
        uVar24 = uVar21 - uVar27;
        if (uVar21 < uVar27 || uVar24 == 0) break;
        for (uVar32 = 0; uVar32 != uVar14; uVar32 = uVar32 + 1) {
          pHVar15 = local_d60 + uVar32;
          memset(pHVar15,0,0x888);
          local_d60[uVar32].bit_cost_ = INFINITY;
          uVar29 = 0;
          while (uVar29 < *(uint *)((long)pvVar8 + (uVar27 + uVar32) * 4)) {
            pHVar15->data_[data[(long)local_d40 + uVar29]] =
                 pHVar15->data_[data[(long)local_d40 + uVar29]] + 1;
            uVar29 = uVar29 + 1;
            pHVar15->total_count_ = uVar29;
          }
          dVar34 = BrotliPopulationCostDistance(pHVar15);
          pHVar15->bit_cost_ = dVar34;
          new_clusters[uVar32] = (uint32_t)uVar32;
          symbols[uVar32] = (uint32_t)uVar32;
          sizes[uVar32] = 1;
          local_d40 = (double)((long)local_d40 + uVar29);
        }
        if (0x3f < uVar24) {
          uVar24 = 0x40;
        }
        sVar31 = BrotliHistogramCombineDistance
                           (local_d60,sizes,symbols,new_clusters,local_cf8,uVar24,uVar24,0x40,0x800)
        ;
        uVar24 = (long)local_d28 + sVar31;
        if (local_d30 < uVar24) {
          uVar32 = local_d30;
          if (local_d30 == 0) {
            uVar32 = uVar24;
          }
          do {
            uVar29 = uVar32;
            uVar32 = uVar29 * 2;
          } while (uVar29 < uVar24);
          pHVar15 = (HistogramDistance *)BrotliAllocate(m,uVar29 * 0x890);
          if (local_d30 != 0) {
            memcpy(pHVar15,out,local_d30 * 0x890);
          }
          BrotliFree(m,out);
          out = pHVar15;
          local_d30 = uVar29;
        }
        uVar24 = local_d00 + sVar31;
        if (local_cd8 < uVar24) {
          uVar32 = local_cd8;
          if (local_cd8 == 0) {
            uVar32 = uVar24;
          }
          do {
            uVar29 = uVar32;
            uVar32 = uVar29 * 2;
          } while (uVar29 < uVar24);
          puVar16 = (uint32_t *)BrotliAllocate(m,uVar29 * 4);
          if (local_cd8 != 0) {
            memcpy(puVar16,local_d18,local_cd8 << 2);
          }
          BrotliFree(m,local_d18);
          local_d18 = puVar16;
          local_cd8 = uVar29;
        }
        pHVar15 = out + (long)local_d28;
        for (sVar18 = 0; sVar31 != sVar18; sVar18 = sVar18 + 1) {
          uVar5 = new_clusters[sVar18];
          memcpy(pHVar15,local_d60 + uVar5,0x890);
          local_d18[local_d00 + sVar18] = sizes[uVar5];
          remap[new_clusters[sVar18]] = (uint32_t)sVar18;
          pHVar15 = pHVar15 + 1;
        }
        local_d00 = local_d00 + sVar18;
        local_d28 = (void *)((long)local_d28 + sVar18);
        for (uVar24 = 0; uVar14 != uVar24; uVar24 = uVar24 + 1) {
          local_ce8[uVar24] = remap[symbols[uVar24]] + (int)uVar9;
        }
        uVar9 = uVar9 + sVar31;
        uVar27 = uVar27 + 0x40;
        uVar13 = uVar13 - 0x40;
        local_ce8 = local_ce8 + 0x40;
      }
      BrotliFree(m,local_d60);
      uVar13 = (uVar9 >> 1) * uVar9;
      if (uVar9 << 6 < uVar13) {
        uVar13 = uVar9 << 6;
      }
      if (0x800 < uVar13) {
        BrotliFree(m,local_cf8);
        local_cf8 = (HistogramPair *)BrotliAllocate(m,uVar13 * 0x18 + 0x18);
      }
      if (uVar9 == 0) {
        puVar16 = (uint32_t *)0x0;
      }
      else {
        puVar16 = (uint32_t *)BrotliAllocate(m,uVar9 * 4);
      }
      for (uVar27 = 0; uVar9 != uVar27; uVar27 = uVar27 + 1) {
        puVar16[uVar27] = (uint32_t)uVar27;
      }
      sVar31 = BrotliHistogramCombineDistance
                         (out,local_d18,local_d38,puVar16,local_cf8,uVar9,uVar21,0x100,uVar13);
      BrotliFree(m,local_cf8);
      BrotliFree(m,local_d18);
      if (uVar9 == 0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = BrotliAllocate(m,uVar9 * 4);
      }
      for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        *(undefined4 *)((long)pvVar11 + uVar13 * 4) = 0xffffffff;
      }
      local_d60 = (HistogramDistance *)0x0;
      iVar20 = 0;
      for (uVar13 = 0; uVar13 != uVar21; uVar13 = uVar13 + 1) {
        memset(&local_8c0,0,0x888);
        local_8c0.bit_cost_ = INFINITY;
        uVar27 = 0;
        while (uVar27 < *(uint *)((long)pvVar8 + uVar13 * 4)) {
          local_8c0.data_[data[(long)local_d60 + uVar27]] =
               local_8c0.data_[data[(long)local_d60 + uVar27]] + 1;
          uVar27 = uVar27 + 1;
          local_8c0.total_count_ = uVar27;
        }
        lVar26 = uVar13 - 1;
        if (uVar13 == 0) {
          lVar26 = 0;
        }
        uVar9 = (ulong)local_d38[lVar26];
        local_d40 = BrotliHistogramBitCostDistanceDistance(&local_8c0,out + uVar9);
        local_d60 = (HistogramDistance *)((long)local_d60 + uVar27);
        for (sVar18 = 0; sVar31 != sVar18; sVar18 = sVar18 + 1) {
          dVar34 = BrotliHistogramBitCostDistanceDistance(&local_8c0,out + puVar16[sVar18]);
          if (dVar34 < local_d40) {
            uVar9 = (ulong)puVar16[sVar18];
            local_d40 = dVar34;
          }
        }
        local_d38[uVar13] = (uint32_t)uVar9;
        if (*(int *)((long)pvVar11 + uVar9 * 4) == -1) {
          *(int *)((long)pvVar11 + uVar9 * 4) = iVar20;
          iVar20 = iVar20 + 1;
        }
      }
      BrotliFree(m,puVar16);
      BrotliFree(m,out);
      uVar13 = *(ulong *)(sampling_stride_length + 0x20);
      if (uVar13 < uVar21) {
        if (uVar13 == 0) {
          uVar13 = uVar21;
        }
        do {
          uVar27 = uVar13;
          uVar13 = uVar27 * 2;
        } while (uVar27 < uVar21);
        pvVar12 = BrotliAllocate(m,uVar27);
        if (*(size_t *)(sampling_stride_length + 0x20) != 0) {
          memcpy(pvVar12,*(void **)(sampling_stride_length + 0x10),
                 *(size_t *)(sampling_stride_length + 0x20));
        }
        BrotliFree(m,*(void **)(sampling_stride_length + 0x10));
        *(void **)(sampling_stride_length + 0x10) = pvVar12;
        *(ulong *)(sampling_stride_length + 0x20) = uVar27;
      }
      uVar13 = *(ulong *)(sampling_stride_length + 0x28);
      if (uVar13 < uVar21) {
        if (uVar13 == 0) {
          uVar13 = uVar21;
        }
        do {
          uVar27 = uVar13;
          uVar13 = uVar27 * 2;
        } while (uVar27 < uVar21);
        pvVar12 = BrotliAllocate(m,uVar27 * 4);
        if (*(long *)(sampling_stride_length + 0x28) != 0) {
          memcpy(pvVar12,*(void **)(sampling_stride_length + 0x18),
                 *(long *)(sampling_stride_length + 0x28) << 2);
        }
        BrotliFree(m,*(void **)(sampling_stride_length + 0x18));
        *(void **)(sampling_stride_length + 0x18) = pvVar12;
        *(ulong *)(sampling_stride_length + 0x28) = uVar27;
      }
      uVar27 = 0;
      lVar26 = 0;
      uVar13 = 0;
      do {
        iVar20 = 0;
        uVar9 = uVar27;
        do {
          uVar27 = uVar9 + 1;
          uVar14 = uVar13 & 0xff;
          if (uVar27 - uVar21 == 1) {
            *(long *)(sampling_stride_length + 8) = lVar26;
            *(ulong *)sampling_stride_length = uVar14 + 1;
            BrotliFree(m,pvVar11);
            BrotliFree(m,pvVar8);
            BrotliFree(m,local_d38);
            BrotliFree(m,pvVar7);
            return;
          }
          iVar20 = iVar20 + *(int *)((long)pvVar8 + uVar27 * 4 + -4);
          puVar22 = local_d38 + uVar9;
        } while ((uVar27 != uVar21) && (uVar9 = uVar27, *puVar22 == local_d38[uVar27]));
        uVar5 = *(uint *)((long)pvVar11 + (ulong)*puVar22 * 4);
        bVar19 = (byte)uVar5;
        *(byte *)(*(long *)(sampling_stride_length + 0x10) + lVar26) = bVar19;
        *(int *)(*(long *)(sampling_stride_length + 0x18) + lVar26 * 4) = iVar20;
        bVar25 = (byte)uVar13;
        uVar13 = (ulong)uVar5;
        if (bVar19 < bVar25) {
          uVar13 = uVar14;
        }
        lVar26 = lVar26 + 1;
      } while( true );
    }
    lVar26 = *(long *)(sampling_stride_length + 8);
    uVar21 = *(ulong *)(sampling_stride_length + 0x20);
    uVar13 = lVar26 + 1;
    if (uVar21 < uVar13) {
      if (uVar21 == 0) {
        uVar21 = uVar13;
      }
      do {
        uVar27 = uVar21;
        uVar21 = uVar27 * 2;
      } while (uVar27 < uVar13);
      pvVar7 = BrotliAllocate(m,uVar27);
      if (*(size_t *)(sampling_stride_length + 0x20) != 0) {
        memcpy(pvVar7,*(void **)(sampling_stride_length + 0x10),
               *(size_t *)(sampling_stride_length + 0x20));
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x10));
      *(void **)(sampling_stride_length + 0x10) = pvVar7;
      *(ulong *)(sampling_stride_length + 0x20) = uVar27;
      lVar26 = *(long *)(sampling_stride_length + 8);
      uVar13 = lVar26 + 1;
    }
    uVar21 = *(ulong *)(sampling_stride_length + 0x28);
    if (uVar21 < uVar13) {
      if (uVar21 == 0) {
        uVar21 = uVar13;
      }
      do {
        uVar27 = uVar21;
        uVar21 = uVar27 * 2;
      } while (uVar27 < uVar13);
      pvVar7 = BrotliAllocate(m,uVar27 * 4);
      if (*(long *)(sampling_stride_length + 0x28) != 0) {
        memcpy(pvVar7,*(void **)(sampling_stride_length + 0x18),
               *(long *)(sampling_stride_length + 0x28) << 2);
      }
      BrotliFree(m,*(void **)(sampling_stride_length + 0x18));
      *(void **)(sampling_stride_length + 0x18) = pvVar7;
      *(ulong *)(sampling_stride_length + 0x28) = uVar27;
      lVar26 = *(long *)(sampling_stride_length + 8);
    }
    *(undefined8 *)sampling_stride_length = 1;
    *(undefined1 *)(*(long *)(sampling_stride_length + 0x10) + lVar26) = 0;
    lVar26 = *(long *)(sampling_stride_length + 8);
    *(int *)(*(long *)(sampling_stride_length + 0x18) + lVar26 * 4) = (int)length;
    *(long *)(sampling_stride_length + 8) = lVar26 + 1;
  }
  return;
}

Assistant:

static void FN(SplitByteVector)(MemoryManager* m,
                                const DataType* data, const size_t length,
                                const size_t literals_per_histogram,
                                const size_t max_histograms,
                                const size_t sampling_stride_length,
                                const double block_switch_cost,
                                const BrotliEncoderParams* params,
                                BlockSplit* split) {
  const size_t data_size = FN(HistogramDataSize)();
  size_t num_histograms = length / literals_per_histogram + 1;
  HistogramType* histograms;
  if (num_histograms > max_histograms) {
    num_histograms = max_histograms;
  }
  if (length == 0) {
    split->num_types = 1;
    return;
  } else if (length < kMinLengthForBlockSplitting) {
    BROTLI_ENSURE_CAPACITY(m, uint8_t,
        split->types, split->types_alloc_size, split->num_blocks + 1);
    BROTLI_ENSURE_CAPACITY(m, uint32_t,
        split->lengths, split->lengths_alloc_size, split->num_blocks + 1);
    if (BROTLI_IS_OOM(m)) return;
    split->num_types = 1;
    split->types[split->num_blocks] = 0;
    split->lengths[split->num_blocks] = (uint32_t)length;
    split->num_blocks++;
    return;
  }
  histograms = BROTLI_ALLOC(m, HistogramType, num_histograms);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(histograms)) return;
  /* Find good entropy codes. */
  FN(InitialEntropyCodes)(data, length,
                          sampling_stride_length,
                          num_histograms, histograms);
  FN(RefineEntropyCodes)(data, length,
                         sampling_stride_length,
                         num_histograms, histograms);
  {
    /* Find a good path through literals with the good entropy codes. */
    uint8_t* block_ids = BROTLI_ALLOC(m, uint8_t, length);
    size_t num_blocks = 0;
    const size_t bitmaplen = (num_histograms + 7) >> 3;
    double* insert_cost = BROTLI_ALLOC(m, double, data_size * num_histograms);
    double* cost = BROTLI_ALLOC(m, double, num_histograms);
    uint8_t* switch_signal = BROTLI_ALLOC(m, uint8_t, length * bitmaplen);
    uint16_t* new_id = BROTLI_ALLOC(m, uint16_t, num_histograms);
    const size_t iters = params->quality < HQ_ZOPFLIFICATION_QUALITY ? 3 : 10;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(block_ids) ||
        BROTLI_IS_NULL(insert_cost) || BROTLI_IS_NULL(cost) ||
        BROTLI_IS_NULL(switch_signal) || BROTLI_IS_NULL(new_id)) {
      return;
    }
    for (i = 0; i < iters; ++i) {
      num_blocks = FN(FindBlocks)(data, length,
                                  block_switch_cost,
                                  num_histograms, histograms,
                                  insert_cost, cost, switch_signal,
                                  block_ids);
      num_histograms = FN(RemapBlockIds)(block_ids, length,
                                         new_id, num_histograms);
      FN(BuildBlockHistograms)(data, length, block_ids,
                               num_histograms, histograms);
    }
    BROTLI_FREE(m, insert_cost);
    BROTLI_FREE(m, cost);
    BROTLI_FREE(m, switch_signal);
    BROTLI_FREE(m, new_id);
    BROTLI_FREE(m, histograms);
    FN(ClusterBlocks)(m, data, length, num_blocks, block_ids, split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, block_ids);
  }
}